

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall google::protobuf::io::CordInputStream::Skip(CordInputStream *this,int count)

{
  int count_local;
  CordInputStream *this_local;
  
  if (this->available_ < (ulong)(long)count) {
    if (this->bytes_remaining_ < (ulong)(long)count) {
      NextChunk(this,this->bytes_remaining_);
      this_local._7_1_ = false;
    }
    else {
      NextChunk(this,(long)count);
      this_local._7_1_ = true;
    }
  }
  else {
    this->available_ = this->available_ - (long)count;
    this->bytes_remaining_ = this->bytes_remaining_ - (long)count;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool CordInputStream::Skip(int count) {
  // Short circuit if we stay inside the current chunk.
  if (static_cast<size_t>(count) <= available_) {
    available_ -= count;
    bytes_remaining_ -= count;
    return true;
  }

  // Sanity check the skip count.
  if (static_cast<size_t>(count) <= bytes_remaining_) {
    // Skip to end: do not return EOF condition: skipping into EOF is ok.
    NextChunk(count);
    return true;
  }
  NextChunk(bytes_remaining_);
  return false;
}